

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration.c
# Opt level: O2

double * inform_integration_evidence
                   (int *series,size_t l,size_t n,int *b,double *evidence,inform_error *err)

{
  double dVar1;
  _Bool _Var2;
  size_t i;
  double *__ptr;
  double *pdVar3;
  size_t sVar4;
  size_t *xs;
  double dVar5;
  inform_error iVar6;
  
  if (series == (int *)0x0) {
    if (err == (inform_error *)0x0) {
      return (double *)0x0;
    }
    iVar6 = INFORM_ETIMESERIES;
  }
  else {
    if (1 < l) {
      __ptr = evidence;
      if ((evidence != (double *)0x0) || (__ptr = (double *)malloc(n << 4), __ptr != (double *)0x0))
      {
        pdVar3 = (double *)malloc(n * 8);
        if (pdVar3 != (double *)0x0) {
          for (sVar4 = 0; n != sVar4; sVar4 = sVar4 + 1) {
            __ptr[sVar4] = INFINITY;
            __ptr[n + sVar4] = -INFINITY;
          }
          xs = inform_first_partitioning(l);
          while (sVar4 = inform_next_partitioning(xs,l), sVar4 != 0) {
            inform_integration_evidence_part(series,l,n,b,xs,sVar4,pdVar3,err);
            _Var2 = inform_failed(err);
            if (_Var2) break;
            for (sVar4 = 0; n != sVar4; sVar4 = sVar4 + 1) {
              dVar1 = pdVar3[sVar4];
              dVar5 = __ptr[sVar4];
              if (dVar1 <= __ptr[sVar4]) {
                dVar5 = dVar1;
              }
              __ptr[sVar4] = dVar5;
              dVar5 = __ptr[n + sVar4];
              if (__ptr[n + sVar4] <= dVar1) {
                dVar5 = dVar1;
              }
              __ptr[n + sVar4] = dVar5;
            }
          }
          free(xs);
          free(pdVar3);
          _Var2 = inform_failed(err);
          pdVar3 = (double *)0x0;
          if (!_Var2) {
            pdVar3 = __ptr;
          }
          if (_Var2 && evidence == (double *)0x0) {
            free(__ptr);
            return (double *)0x0;
          }
          return pdVar3;
        }
        if (evidence == (double *)0x0) {
          free(__ptr);
        }
      }
      if (err == (inform_error *)0x0) {
        return (double *)0x0;
      }
      *err = INFORM_ENOMEM;
      return (double *)0x0;
    }
    if (err == (inform_error *)0x0) {
      return (double *)0x0;
    }
    iVar6 = INFORM_ENOSOURCES;
  }
  *err = iVar6;
  return (double *)0x0;
}

Assistant:

double *inform_integration_evidence(int const *series, size_t l, size_t n,
    int const *b, double *evidence, inform_error *err)
{
    if (check_arguments(series, l, err))
    {
        return NULL;
    }
    int allocate = (evidence == NULL);
    if (allocate)
    {
        evidence = malloc(2 * n * sizeof(double));
        if (evidence == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }
    double *lmi = malloc(n * sizeof(double));
    if (lmi == NULL)
    {
        if (allocate) free(evidence);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    double *minimum = evidence;
    double *maximum = minimum + n;
    for (size_t i = 0; i < n; ++i)
    {
        minimum[i] = INFINITY;
        maximum[i] = -INFINITY;
    }

    size_t *parts = inform_first_partitioning(l);
    size_t nparts = 1;
    while ((nparts = inform_next_partitioning(parts, l)))
    {
        inform_integration_evidence_part(series, l, n, b, parts, nparts, lmi, err);
        if (inform_failed(err))
        {
            break;
        }
        for (size_t i = 0; i < n; ++i)
        {
            minimum[i] = MIN(minimum[i], lmi[i]);
            maximum[i] = MAX(maximum[i], lmi[i]);
        }
    }
    free(parts);
    free(lmi);
    
    if (inform_failed(err))
    {
        if (allocate)
        {
            free(evidence);
        }
        return NULL;
    }

    return evidence;
}